

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedCapacityPriorityQueue.h
# Opt level: O2

bool __thiscall
FixedCapacityPriorityQueue<std::pair<double,_unsigned_int>,_Problem_CGBG_FF::diPairComp>::insert
          (FixedCapacityPriorityQueue<std::pair<double,_unsigned_int>,_Problem_CGBG_FF::diPairComp>
           *this,pair<double,_unsigned_int> *a,pair<double,_unsigned_int> *overflown_T)

{
  _List_node_base *p_Var1;
  size_t sVar2;
  size_t sVar3;
  _List_node_base *p_Var4;
  bool bVar5;
  const_iterator __position;
  iterator last;
  
  sVar2 = (this->_m_l).
          super__List_base<std::pair<double,_unsigned_int>,_std::allocator<std::pair<double,_unsigned_int>_>_>
          ._M_impl._M_node._M_size;
  sVar3 = this->_m_capacity;
  if (sVar2 == sVar3) {
    p_Var4 = (this->_m_l).
             super__List_base<std::pair<double,_unsigned_int>,_std::allocator<std::pair<double,_unsigned_int>_>_>
             ._M_impl._M_node.super__List_node_base._M_prev;
    p_Var1 = p_Var4[1]._M_next;
    if ((double)p_Var1 <= a->first) {
      overflown_T->first = a->first;
      overflown_T->second = a->second;
LAB_0040c38c:
      return sVar2 == sVar3;
    }
    overflown_T->first = (double)p_Var1;
    overflown_T->second = *(uint *)&p_Var4[1]._M_prev;
    std::__cxx11::
    list<std::pair<double,_unsigned_int>,_std::allocator<std::pair<double,_unsigned_int>_>_>::
    pop_back(&this->_m_l);
  }
  bVar5 = true;
  __position._M_node = (_List_node_base *)this;
  do {
    __position._M_node =
         (((FixedCapacityPriorityQueue<std::pair<double,_unsigned_int>,_Problem_CGBG_FF::diPairComp>
            *)__position._M_node)->_m_l).
         super__List_base<std::pair<double,_unsigned_int>,_std::allocator<std::pair<double,_unsigned_int>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    do {
      if (((FixedCapacityPriorityQueue<std::pair<double,_unsigned_int>,_Problem_CGBG_FF::diPairComp>
            *)__position._M_node == this) || (!bVar5)) {
        std::__cxx11::
        list<std::pair<double,_unsigned_int>,_std::allocator<std::pair<double,_unsigned_int>_>_>::
        insert(&this->_m_l,__position,a);
        goto LAB_0040c38c;
      }
      bVar5 = (double)__position._M_node[1]._M_next <= a->first;
    } while (a->first < (double)__position._M_node[1]._M_next);
  } while( true );
}

Assistant:

bool FixedCapacityPriorityQueue<T,_Compare>::insert( T& a, T& overflown_T )
{
    bool overflow = ( _m_l.size() == _m_capacity);
    bool skip_insert = false;

    if(overflow) //check if we need to make space at the end
    {
        // overflown_Tp is the T* to which overflown_Tpp points
        // we set the former to point to the overflown element.
        //T* & overflown_Tp = *overflown_Tpp;

        T& last_in_queue = _m_l.back();
        //std::less< T > theLessOp;
        _Compare theLessOp;
        if( theLessOp( last_in_queue,  a) )
        //if( last_in_queue <  a ) //doesn't work automatically...
        {
            //This does not work with (or need) pointers, 
            //this simply points to last position in queue !!!
            //overflown_Tp = &last_in_queue;             
            
            //rather copy the value of the stuff we will throw out!
            overflown_T = last_in_queue; 
            _m_l.pop_back();
        }
        else
        {
            overflown_T = a;
            skip_insert = true;
        }
    }

    if(!skip_insert)
    {
        //insert a at the appropriate place
        typename std::list<T>::iterator it = _m_l.begin();
        typename std::list<T>::iterator last = _m_l.end();
        bool not_positioned = true; //so long as it does not point to the correct pos.
        //std::less< T > theLessOp;
        _Compare theLessOp;
        while(it != last && not_positioned)
        {
            if( theLessOp( *it, a ) )
                not_positioned = false;
            else
                it++;
        }
        _m_l.insert( it, a);
    }
#if 0 && DEBUG_FCPQ
    std::cout << "----AFTER POP AND INSERT\nthe overflown_Tp=" <<overflown_Tp << ", which means it points to..." <<std::endl ;
    if(overflown_Tp != NULL)
    {
        T& the_overflown_T = (*overflown_Tp);
        std::string typestr = " JPPVValPair* ";
        std::cout << "the_overflown_T [T="<< typestr <<
            "]=" << the_overflown_T << ", which points to..."<<std::endl;

        if(the_overflown_T != NULL)
            std::cout<< (*the_overflown_T).SoftPrintBrief() << std::endl;
        else
            std::cout << "nothing" <<std::endl;
    }
    else
        std::cout << " nothing." << std::endl;
    
    std::cout << "----" <<std::endl ;
#endif
    
    return(overflow);
}